

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O2

void __thiscall numericalwords_belowHundred_Test::TestBody(numericalwords_belowHundred_Test *this)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  double dVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  AssertionResult gtest_ar_1;
  string st2;
  size_t index;
  allocator_type local_1c6;
  allocator local_1c5;
  allocator local_1c4;
  allocator local_1c3;
  allocator local_1c2;
  allocator_type local_1c1;
  AssertHelper local_1c0;
  AssertHelper local_1b8;
  long local_1b0;
  string st;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  double local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ones;
  
  std::__cxx11::string::string((string *)&st,"",(allocator *)&st2);
  std::__cxx11::string::string(local_188,"one",(allocator *)&tens);
  std::__cxx11::string::string(local_168,"two",(allocator *)&gtest_ar_1);
  std::__cxx11::string::string(local_148,"three",(allocator *)&index);
  std::__cxx11::string::string(local_128,"four",(allocator *)&local_1c0);
  std::__cxx11::string::string(local_108,"five",(allocator *)&local_1b8);
  std::__cxx11::string::string(local_e8,"six",&local_1c2);
  std::__cxx11::string::string(local_c8,"seven",&local_1c3);
  std::__cxx11::string::string(local_a8,"eight",&local_1c4);
  std::__cxx11::string::string(local_88,"nine",&local_1c5);
  __l._M_len = 10;
  __l._M_array = &st;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&ones,__l,&local_1c6);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string(local_188 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::string((string *)&st,"",(allocator *)&st2);
  std::__cxx11::string::string(local_188,"-",(allocator *)&gtest_ar_1);
  std::__cxx11::string::string(local_168,"twenty",(allocator *)&index);
  std::__cxx11::string::string(local_148,"thirty",(allocator *)&local_1c0);
  std::__cxx11::string::string(local_128,"forty",(allocator *)&local_1b8);
  std::__cxx11::string::string(local_108,"fifty",&local_1c2);
  std::__cxx11::string::string(local_e8,"sixty",&local_1c3);
  std::__cxx11::string::string(local_c8,"seventy",&local_1c4);
  std::__cxx11::string::string(local_a8,"eighty",&local_1c5);
  std::__cxx11::string::string(local_88,"ninety",(allocator *)&local_1c6);
  __l_00._M_len = 10;
  __l_00._M_array = &st;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&tens,__l_00,&local_1c1);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string(local_188 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  index = 0;
  local_1b0 = 0x20;
  iVar4 = 1;
  while( true ) {
    if (iVar4 == 100) break;
    bVar1 = (byte)(((ushort)iVar4 & 0xff) / 10);
    std::__cxx11::string::string
              ((string *)&st,
               (string *)
               (tens.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + bVar1));
    bVar2 = std::operator==(&st,"-");
    if (!bVar2) {
      std::__cxx11::string::append((string *)&st);
      dVar6 = units::detail::testing::testNumericalWords(&st,&index);
      local_68 = (double)iVar4;
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)&st2,"val","static_cast<double>(ii)",dVar6,local_68);
      if ((char)st2._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&gtest_ar_1);
        pcVar5 = "";
        if (st2._M_string_length != 0) {
          pcVar5 = *(char **)st2._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
                   ,0x10d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&gtest_ar_1);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&st2._M_string_length);
      std::__cxx11::string::string
                ((string *)&st2,
                 (string *)
                 (tens.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + bVar1));
      if (st2._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&st2);
        std::__cxx11::string::append((string *)&st2);
        if (*(char *)(CONCAT71(st2._M_dataplus._M_p._1_7_,(char)st2._M_dataplus._M_p) + -1 +
                     st2._M_string_length) != '-') {
          dVar6 = units::detail::testing::testNumericalWords(&st2,&index);
          testing::internal::CmpHelperFloatingPointEQ<double>
                    ((internal *)&gtest_ar_1,"val2","static_cast<double>(ii)",dVar6,local_68);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&local_1c0);
            pcVar5 = "";
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = *(char **)gtest_ar_1.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_1b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
                       ,0x119,pcVar5);
            testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1c0);
            testing::internal::AssertHelper::~AssertHelper(&local_1b8);
            if (local_1c0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_1c0.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_1.message_);
        }
      }
      std::__cxx11::string::~string((string *)&st2);
    }
    std::__cxx11::string::~string((string *)&st);
    iVar4 = iVar4 + 1;
    local_1b0 = local_1b0 + 0x20;
  }
  std::__cxx11::string::string((string *)&st,"zero",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"zero\", index)","0.0",dVar6,0.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"ten",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"ten\", index)","10.0",dVar6,10.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"eleven",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"eleven\", index)","11.0",dVar6,11.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"twelve",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"twelve\", index)","12.0",dVar6,12.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"thirteen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"thirteen\", index)","13.0",dVar6,13.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x11f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"fourteen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"fourteen\", index)","14.0",dVar6,14.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x120,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"fifteen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"fifteen\", index)","15.0",dVar6,15.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x121,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"sixteen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"sixteen\", index)","16.0",dVar6,16.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x122,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"seventeen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"seventeen\", index)","17.0",dVar6,17.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x123,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"eighteen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"eighteen\", index)","18.0",dVar6,18.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x124,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::__cxx11::string::string((string *)&st,"nineteen",(allocator *)&gtest_ar_1);
  dVar6 = units::detail::testing::testNumericalWords(&st,&index);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&st2,"testNumericalWords(\"nineteen\", index)","19.0",dVar6,19.0);
  std::__cxx11::string::~string((string *)&st);
  if ((char)st2._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&st);
    if (st2._M_string_length == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)st2._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_leadingNumbers.cpp"
               ,0x125,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&st);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if (st._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)st._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&st2._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tens);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ones);
  return;
}

Assistant:

TEST(numericalwords, belowHundred)
{
    std::vector<std::string> ones{
        "",
        "one",
        "two",
        "three",
        "four",
        "five",
        "six",
        "seven",
        "eight",
        "nine"};
    std::vector<std::string> tens{
        "",
        "-",
        "twenty",
        "thirty",
        "forty",
        "fifty",
        "sixty",
        "seventy",
        "eighty",
        "ninety"};
    size_t index = 0;
    for (int ii = 1; ii <= 99; ++ii) {
        std::string st = tens[ii / 10];
        if (st == "-") {
            continue;
        }
        st += ones[ii % 10];

        double val = testNumericalWords(st, index);
        EXPECT_DOUBLE_EQ(val, static_cast<double>(ii));

        std::string st2 = tens[ii / 10];
        if (st2.empty()) {
            continue;
        }
        st2.push_back('-');
        st2 += ones[ii % 10];
        if (st2.back() == '-') {
            continue;
        }
        double val2 = testNumericalWords(st2, index);
        EXPECT_DOUBLE_EQ(val2, static_cast<double>(ii));
    }
    EXPECT_DOUBLE_EQ(testNumericalWords("zero", index), 0.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("ten", index), 10.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("eleven", index), 11.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("twelve", index), 12.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("thirteen", index), 13.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("fourteen", index), 14.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("fifteen", index), 15.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("sixteen", index), 16.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("seventeen", index), 17.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("eighteen", index), 18.0);
    EXPECT_DOUBLE_EQ(testNumericalWords("nineteen", index), 19.0);
}